

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgBuiltinFunctions.hpp
# Opt level: O1

void __thiscall
rsg::
UnaryBuiltinVecFunc<rsg::GetUnaryBuiltinVecWeight<rsg::AsinOp>,_rsg::ComputeUnaryBuiltinVecRange<rsg::AsinOp>,_rsg::EvaluateUnaryBuiltinVec<rsg::AsinOp>_>
::~UnaryBuiltinVecFunc
          (UnaryBuiltinVecFunc<rsg::GetUnaryBuiltinVecWeight<rsg::AsinOp>,_rsg::ComputeUnaryBuiltinVecRange<rsg::AsinOp>,_rsg::EvaluateUnaryBuiltinVec<rsg::AsinOp>_>
           *this)

{
  ~UnaryBuiltinVecFunc(this);
  operator_delete(this,200);
  return;
}

Assistant:

UnaryBuiltinVecFunc<GetValueRangeWeight, ComputeValueRange, Evaluate>::~UnaryBuiltinVecFunc (void)
{
	delete m_child;
}